

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_parse_result * __thiscall
pugi::xml_document::load
          (xml_parse_result *__return_storage_ptr__,xml_document *this,
          basic_istream<wchar_t,_std::char_traits<wchar_t>_> *stream,uint options)

{
  uint uVar1;
  xml_encoding encoding;
  long lVar2;
  long lVar3;
  xml_stream_chunk<wchar_t> *pxVar4;
  xml_stream_chunk<wchar_t> *pxVar5;
  ulong uVar6;
  ulong uVar7;
  xml_stream_chunk<wchar_t> *pxVar8;
  xml_parse_status xVar9;
  ulong uVar10;
  void *result;
  xml_stream_chunk<wchar_t> *pxVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<wchar_t>_> local_58;
  xml_document *local_48;
  xml_parse_result *local_40;
  xml_document_struct *local_38;
  
  reset(this);
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_io_error;
    goto LAB_0011f0e6;
  }
  local_38 = (xml_document_struct *)(this->super_xml_node)._root;
  local_48 = this;
  lVar2 = std::wistream::tellg();
  if (lVar2 < 0) {
    local_40 = __return_storage_ptr__;
    std::wios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
    local_58.deleter = impl::anon_unknown_0::xml_stream_chunk<wchar_t>::destroy;
    uVar1 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
    pxVar4 = (xml_stream_chunk<wchar_t> *)0x0;
    uVar10 = 0;
    pxVar11 = (xml_stream_chunk<wchar_t> *)0x0;
LAB_0011ef6f:
    local_58.data = pxVar11;
    if ((uVar1 & 2) != 0) {
      pxVar4 = (xml_stream_chunk<wchar_t> *)
               (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(uVar10 + 1);
      if (pxVar4 != (xml_stream_chunk<wchar_t> *)0x0) {
        pxVar8 = (xml_stream_chunk<wchar_t> *)((long)pxVar4->data + (uVar10 - 0x10));
        pxVar5 = pxVar4;
        for (; pxVar11 != (xml_stream_chunk<wchar_t> *)0x0; pxVar11 = pxVar11->next) {
          if (pxVar8 < (xml_stream_chunk<wchar_t> *)((long)pxVar5->data + (pxVar11->size - 0x10))) {
            __assert_fail("write + chunk->size <= buffer + total",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                          ,0x1321,
                          "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                         );
          }
          memcpy(pxVar5,pxVar11->data,pxVar11->size);
          pxVar5 = (xml_stream_chunk<wchar_t> *)((long)pxVar5->data + (pxVar11->size - 0x10));
        }
        xVar9 = status_ok;
        if (pxVar5 != pxVar8) {
          __assert_fail("write == buffer + total",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x1326,
                        "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                       );
        }
        goto LAB_0011f070;
      }
      xVar9 = status_out_of_memory;
      goto LAB_0011f06a;
    }
    pxVar5 = (xml_stream_chunk<wchar_t> *)
             (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                       allocate)(0x7fe8);
    if (pxVar5 != (xml_stream_chunk<wchar_t> *)0x0) {
      pxVar5->next = (xml_stream_chunk<wchar_t> *)0x0;
      pxVar5->size = 0;
      local_58.data = pxVar5;
      if (pxVar4 != (xml_stream_chunk<wchar_t> *)0x0) {
        pxVar4->next = pxVar5;
        local_58.data = pxVar11;
      }
      std::wistream::read((wchar_t *)stream,(long)pxVar5->data);
      uVar6 = *(long *)(stream + 8) * 4;
      pxVar5->size = uVar6;
      uVar1 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
      if (((uVar1 & 1) == 0) && ((uVar1 & 6) != 4)) goto code_r0x0011efe2;
      xVar9 = status_io_error;
      goto LAB_0011f06a;
    }
    goto LAB_0011f002;
  }
  auVar13 = std::wistream::tellg();
  lVar2 = auVar13._0_8_;
  xVar9 = status_io_error;
  std::wistream::seekg((long)stream,_S_beg);
  lVar3 = std::wistream::tellg();
  std::wistream::seekg(stream,lVar2,auVar13._8_8_);
  if (-1 < lVar2 && ((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) {
    uVar10 = lVar3 - lVar2;
    if (-1 < (long)uVar10) {
      pxVar4 = (xml_stream_chunk<wchar_t> *)
               (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(uVar10 * 4 + 1);
      local_58.deleter =
           (D)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate;
      local_58.data = pxVar4;
      if (pxVar4 == (xml_stream_chunk<wchar_t> *)0x0) {
        xVar9 = status_out_of_memory;
LAB_0011f083:
        uVar10 = 0;
        pxVar4 = (xml_stream_chunk<wchar_t> *)0x0;
      }
      else {
        std::wistream::read((wchar_t *)stream,(long)pxVar4);
        if ((*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 6) == 4 ||
            (*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 1) != 0) {
          xVar9 = status_io_error;
          goto LAB_0011f083;
        }
        if (uVar10 < *(ulong *)(stream + 8)) {
          __assert_fail("actual_length <= read_length",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x134b,
                        "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_seek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                       );
        }
        local_58.data = (xml_stream_chunk<wchar_t> *)0x0;
        uVar10 = *(ulong *)(stream + 8) << 2;
        xVar9 = status_ok;
      }
      impl::anon_unknown_0::auto_deleter<void>::~auto_deleter((auto_deleter<void> *)&local_58);
      goto LAB_0011f0d8;
    }
    xVar9 = status_out_of_memory;
  }
  goto LAB_0011f0df;
code_r0x0011efe2:
  uVar7 = uVar6 + uVar10;
  if (uVar6 + uVar10 <= uVar10) {
    uVar7 = uVar10;
  }
  bVar12 = CARRY8(uVar6,uVar10);
  pxVar4 = pxVar5;
  uVar10 = uVar7;
  pxVar11 = local_58.data;
  if (bVar12) goto LAB_0011f002;
  goto LAB_0011ef6f;
LAB_0011f002:
  xVar9 = status_out_of_memory;
LAB_0011f06a:
  uVar10 = 0;
  pxVar4 = (xml_stream_chunk<wchar_t> *)0x0;
LAB_0011f070:
  impl::anon_unknown_0::auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<wchar_t>_>
  ::~auto_deleter(&local_58);
  __return_storage_ptr__ = local_40;
LAB_0011f0d8:
  if (xVar9 == status_ok) {
    local_48 = (xml_document *)&local_48->_buffer;
    encoding = impl::anon_unknown_0::get_buffer_encoding(encoding_wchar,pxVar4,uVar10);
    if (encoding == encoding_utf8) {
      *(undefined1 *)((long)pxVar4->data + (uVar10 - 0x10)) = 0;
      uVar10 = uVar10 + 1;
    }
    impl::anon_unknown_0::load_buffer_impl
              (__return_storage_ptr__,local_38,&local_38->super_xml_node_struct,pxVar4,uVar10,
               options,encoding,true,true,(char_t **)local_48);
    return __return_storage_ptr__;
  }
LAB_0011f0df:
  __return_storage_ptr__->encoding = encoding_auto;
  __return_storage_ptr__->status = xVar9;
LAB_0011f0e6:
  __return_storage_ptr__->offset = 0;
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result xml_document::load(std::basic_istream<wchar_t, std::char_traits<wchar_t> >& stream, unsigned int options)
	{
		reset();

		return impl::load_stream_impl(static_cast<impl::xml_document_struct*>(_root), stream, options, encoding_wchar, &_buffer);
	}